

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testPI(DOMTest *this,DOMDocument *document)

{
  bool bVar1;
  int iVar2;
  DOMOperationType DVar3;
  long *plVar4;
  DOMNode *pDVar5;
  XMLCh *pXVar6;
  wchar16 *pwVar7;
  wchar16 *pwVar8;
  long lVar9;
  DOMDocument *pDVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  DOMDocument *pDVar13;
  DOMNode *pDVar14;
  DOMNode *pDVar15;
  DOMNode *pDVar16;
  ulong uVar17;
  DOMDocument *local_d8;
  DOMException *e;
  DOMNode *myimport;
  DOMNode *mycloned;
  void *myNull2;
  void *mydocument2;
  void *myNull;
  void *mySecond2;
  void *mySecond;
  void *myFirst2;
  void *myFirst;
  void *mydocument;
  XMLCh *userSecond;
  DOMNode *userFirst;
  DOMProcessingInstruction *userTest;
  DOMNode *abc51;
  DOMNode *abc50;
  bool OK;
  DOMProcessingInstruction *pI2;
  DOMProcessingInstruction *pI;
  DOMDocument *document_local;
  DOMTest *this_local;
  
  bVar1 = true;
  plVar4 = (long *)(**(code **)(*(long *)document + 0x68))();
  pDVar5 = (DOMNode *)(**(code **)(*plVar4 + 0x38))();
  pXVar6 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x10))();
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pXVar6 + 0x10))();
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar7,pwVar8);
  if (((iVar2 == 0) && (lVar9 = (**(code **)(*(long *)pDVar5 + 0x18))(), lVar9 != 0)) &&
     (lVar9 = (**(code **)(*(long *)pXVar6 + 0x18))(), lVar9 != 0)) {
    pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x18))();
    pwVar8 = (wchar16 *)(**(code **)(*(long *)pXVar6 + 0x18))();
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar7,pwVar8);
    if (iVar2 == 0) goto LAB_001174dd;
  }
  else {
    lVar9 = (**(code **)(*(long *)pDVar5 + 0x18))();
    if ((lVar9 == 0) && (lVar9 = (**(code **)(*(long *)pXVar6 + 0x18))(), lVar9 == 0))
    goto LAB_001174dd;
  }
  fprintf(_stderr,"\'cloneNode\' did not clone the DOMEntity* node correctly\n");
  bVar1 = false;
LAB_001174dd:
  xercesc_4_0::XMLString::transcode
            ("This is #document\'s processing instruction",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x148))();
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar7);
  if (iVar2 != 0) {
    fprintf(_stderr,"Warning!!! PI\'s \'getData\' failed!\n");
    bVar1 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("PI\'s reset data",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0x150))(pDVar5,tempStr);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x148))();
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar7);
  if (iVar2 != 0) {
    fprintf(_stderr,"Warning!!! PI\'s \'setData\' failed!\n");
    bVar1 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("dTargetProcessorChannel",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x140))();
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar7);
  if (iVar2 != 0) {
    fprintf(_stderr,"Warning!!! PI\'s \'getTarget\' failed!\n");
    bVar1 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("This is #document\'s processing instruction",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0x150))(pDVar5,tempStr);
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,0);
  pDVar10 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (document != pDVar10) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x10bc);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,pXVar6,0);
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar6 != pXVar11) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x10c3);
    bVar1 = false;
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,tempStr2,0);
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar12 != tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10cb);
    bVar1 = false;
  }
  if (pXVar6 != pXVar11) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10cf);
    bVar1 = false;
  }
  if (pXVar6 == pXVar12) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10d3);
    bVar1 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr3);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x10db);
    bVar1 = false;
  }
  lVar9 = (**(code **)(*(long *)pXVar6 + 0xf0))(pXVar6,tempStr);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x10e1);
    bVar1 = false;
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,0);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar11 != tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10e9);
    bVar1 = false;
  }
  if (lVar9 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10ed);
    bVar1 = false;
  }
  pDVar13 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,0);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar10 != pDVar13) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10f4);
    bVar1 = false;
  }
  if (lVar9 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x10f8);
    bVar1 = false;
  }
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x10fe);
    bVar1 = false;
  }
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x1102);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,&userhandler);
  pDVar14 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_CLONED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x110a
           );
    bVar1 = false;
  }
  pXVar11 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar11,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x110a);
    bVar1 = false;
  }
  pDVar10 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar10 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x110a);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar15 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x110a);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar15 != pDVar14) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x110a);
    bVar1 = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar15 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar5,1);
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_IMPORTED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x110f
           );
    bVar1 = false;
  }
  pXVar11 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar11,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x110f);
    bVar1 = false;
  }
  pDVar10 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar10 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x110f);
    bVar1 = false;
  }
  pDVar16 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar16 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x110f);
    bVar1 = false;
  }
  pDVar16 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar16 != pDVar15) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x110f);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar15 + 0xe8))(pDVar15,tempStr2,pDVar5,&userhandler);
  (**(code **)(*(long *)pDVar15 + 0x138))();
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_DELETED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x1114
           );
    bVar1 = false;
  }
  pXVar11 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar11,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x1114);
    bVar1 = false;
  }
  pDVar15 = (DOMNode *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar15 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x1114);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar15 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x1114);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar15 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x1114);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if ((uVar17 & 1) == 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0x1118);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pXVar6);
  if ((uVar17 & 1) != 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0x111c);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar14);
  if ((uVar17 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x1122);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if ((uVar17 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x1127);
    bVar1 = false;
  }
  local_d8 = (DOMDocument *)0x0;
  if (document != (DOMDocument *)0x0) {
    local_d8 = document + 0x18;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,local_d8);
  if ((uVar17 & 1) != 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x112b);
    bVar1 = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar5,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xd5);
  if (bVar1 == false) {
    printf("\n*****The PI method calls listed above failed, all others worked correctly.*****\n");
  }
  return bVar1;
}

Assistant:

bool DOMTest::testPI(DOMDocument* document)
{
    DOMProcessingInstruction* pI, *pI2;
    bool OK = true;
// For debugging*****   printf("\n          testPI's outputs:\n");
	DOMNode*   abc50 = document->getDocumentElement()->getFirstChild();// Get doc's DOMProcessingInstruction
    pI  = (DOMProcessingInstruction*) abc50;
	DOMNode*   abc51 = pI->cloneNode(true);//*****?
    pI2 = (DOMProcessingInstruction*) abc51;
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(pI->getNodeName(), pI2->getNodeName()) &&         // Compares node names for equality
         (pI->getNodeValue() != 0 && pI2->getNodeValue() != 0)  // Checks to make sure each node has a value node
        ? !XMLString::compareString(pI->getNodeValue(), pI2->getNodeValue())      // If both have value nodes test those value nodes for equality
        :(pI->getNodeValue() == 0 && pI2->getNodeValue() == 0)))// If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMEntity* node correctly\n");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument
    // compare = "This is [#document: 0]'s processing instruction";  // AH Revisit.  Where id
    //                  this ": 0]" stuff come from in the Java version??  I don' think that it is right.
    XMLString::transcode("This is #document's processing instruction", tempStr, 3999);
    if (XMLString::compareString(tempStr, pI->getData()))
    {
        fprintf(stderr, "Warning!!! PI's 'getData' failed!\n");
        OK = false;
    }

    XMLString::transcode("PI's reset data", tempStr, 3999);
    pI->setData(tempStr);
    if (XMLString::compareString(tempStr, pI->getData()))
    {
        fprintf(stderr, "Warning!!! PI's 'setData' failed!\n");
        OK = false;
    }
    XMLString::transcode("dTargetProcessorChannel", tempStr, 3999);
    if (XMLString::compareString(tempStr, pI->getTarget()))
    {
        fprintf(stderr, "Warning!!! PI's 'getTarget' failed!\n");
        OK = false;
    }


    // Restore original PI data.
    XMLString::transcode("This is #document's processing instruction", tempStr, 3999);
    pI->setData(tempStr);

    // Test the user data
    // Test simple set and get
    DOMProcessingInstruction* userTest = pI;
    DOMNode*  userFirst = abc51;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (abc51->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset(reset)
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(document)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 213 );

    if (!OK)
        printf("\n*****The PI method calls listed above failed, all others worked correctly.*****\n");

    return OK;
}